

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::MaybeParseRepetition(StringPiece *sp,int *lo,int *hi)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 local_38 [8];
  StringPiece s;
  int *hi_local;
  int *lo_local;
  StringPiece *sp_local;
  
  local_38 = (undefined1  [8])sp->ptr_;
  s.ptr_ = *(char **)&sp->length_;
  s._8_8_ = hi;
  iVar3 = StringPiece::size((StringPiece *)local_38);
  if ((iVar3 == 0) || (cVar1 = StringPiece::operator[]((StringPiece *)local_38,0), cVar1 != '{')) {
    sp_local._7_1_ = false;
  }
  else {
    StringPiece::remove_prefix((StringPiece *)local_38,1);
    bVar2 = ParseInteger((StringPiece *)local_38,lo);
    if (bVar2) {
      iVar3 = StringPiece::size((StringPiece *)local_38);
      if (iVar3 == 0) {
        sp_local._7_1_ = false;
      }
      else {
        cVar1 = StringPiece::operator[]((StringPiece *)local_38,0);
        if (cVar1 == ',') {
          StringPiece::remove_prefix((StringPiece *)local_38,1);
          iVar3 = StringPiece::size((StringPiece *)local_38);
          if (iVar3 == 0) {
            return false;
          }
          cVar1 = StringPiece::operator[]((StringPiece *)local_38,0);
          if (cVar1 == '}') {
            *(undefined4 *)s._8_8_ = 0xffffffff;
          }
          else {
            bVar2 = ParseInteger((StringPiece *)local_38,(int *)s._8_8_);
            if (!bVar2) {
              return false;
            }
          }
        }
        else {
          *(int *)s._8_8_ = *lo;
        }
        iVar3 = StringPiece::size((StringPiece *)local_38);
        if ((iVar3 == 0) ||
           (cVar1 = StringPiece::operator[]((StringPiece *)local_38,0), cVar1 != '}')) {
          sp_local._7_1_ = false;
        }
        else {
          StringPiece::remove_prefix((StringPiece *)local_38,1);
          sp->ptr_ = (char *)local_38;
          sp->length_ = (int)s.ptr_;
          sp_local._7_1_ = true;
        }
      }
    }
    else {
      sp_local._7_1_ = false;
    }
  }
  return sp_local._7_1_;
}

Assistant:

static bool MaybeParseRepetition(StringPiece* sp, int* lo, int* hi) {
  StringPiece s = *sp;
  if (s.size() == 0 || s[0] != '{')
    return false;
  s.remove_prefix(1);  // '{'
  if (!ParseInteger(&s, lo))
    return false;
  if (s.size() == 0)
    return false;
  if (s[0] == ',') {
    s.remove_prefix(1);  // ','
    if (s.size() == 0)
      return false;
    if (s[0] == '}') {
      // {2,} means at least 2
      *hi = -1;
    } else {
      // {2,4} means 2, 3, or 4.
      if (!ParseInteger(&s, hi))
        return false;
    }
  } else {
    // {2} means exactly two
    *hi = *lo;
  }
  if (s.size() == 0 || s[0] != '}')
    return false;
  s.remove_prefix(1);  // '}'
  *sp = s;
  return true;
}